

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

int mi_reserve_os_memory_ex
              (size_t size,_Bool commit,_Bool allow_large,_Bool exclusive,mi_arena_id_t *arena_id)

{
  mi_memid_t memid_00;
  mi_memid_t memid_01;
  _Bool _Var1;
  _Bool _Var2;
  void *start;
  char *pcVar3;
  ulong size_00;
  int iVar4;
  mi_memid_t memid;
  anon_union_16_2_8cef793c_for_mem local_48;
  _Bool local_38;
  undefined7 uStack_37;
  
  if (arena_id != (mi_arena_id_t *)0x0) {
    *arena_id = 0;
  }
  size_00 = size + 0x1ffffff & 0xfffffffffe000000;
  start = _mi_os_alloc_aligned(size_00,0x2000000,commit,allow_large,(mi_memid_t *)&local_48.os);
  _Var1 = local_38;
  iVar4 = 0xc;
  if (start != (void *)0x0) {
    memid_00.initially_committed = (_Bool)(undefined1)uStack_37;
    memid_00.initially_zero = (_Bool)uStack_37._1_1_;
    memid_00._19_1_ = uStack_37._2_1_;
    memid_00.memkind = uStack_37._3_4_;
    memid_00.is_pinned = local_38;
    memid_00.mem.os.size = local_48.os.size;
    memid_00.mem.os.base = local_48.os.base;
    _Var2 = mi_manage_os_memory_ex2(start,size_00,local_38,-1,exclusive,memid_00,arena_id);
    if (_Var2) {
      pcVar3 = "";
      if (_Var1 != false) {
        pcVar3 = " (in large os pages)";
      }
      iVar4 = 0;
      _mi_verbose_message("reserved %zu KiB memory%s\n",size_00 >> 10,pcVar3);
    }
    else {
      memid_01.initially_committed = (_Bool)(undefined1)uStack_37;
      memid_01.initially_zero = (_Bool)uStack_37._1_1_;
      memid_01._19_1_ = uStack_37._2_1_;
      memid_01.memkind = uStack_37._3_4_;
      memid_01.is_pinned = local_38;
      memid_01.mem.os.size = local_48.os.size;
      memid_01.mem.os.base = local_48.os.base;
      _mi_os_free_ex(start,size_00,commit,memid_01);
      _mi_verbose_message("failed to reserve %zu KiB memory\n",size_00 >> 10);
    }
  }
  return iVar4;
}

Assistant:

int mi_reserve_os_memory_ex(size_t size, bool commit, bool allow_large, bool exclusive, mi_arena_id_t* arena_id) mi_attr_noexcept {
  if (arena_id != NULL) *arena_id = _mi_arena_id_none();
  size = _mi_align_up(size, MI_ARENA_BLOCK_SIZE); // at least one block
  mi_memid_t memid;
  void* start = _mi_os_alloc_aligned(size, MI_SEGMENT_ALIGN, commit, allow_large, &memid);
  if (start == NULL) return ENOMEM;
  const bool is_large = memid.is_pinned; // todo: use separate is_large field?
  if (!mi_manage_os_memory_ex2(start, size, is_large, -1 /* numa node */, exclusive, memid, arena_id)) {
    _mi_os_free_ex(start, size, commit, memid);
    _mi_verbose_message("failed to reserve %zu KiB memory\n", _mi_divide_up(size, 1024));
    return ENOMEM;
  }
  _mi_verbose_message("reserved %zu KiB memory%s\n", _mi_divide_up(size, 1024), is_large ? " (in large os pages)" : "");
  return 0;
}